

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

int Mvc_CoverIsCubeFree(Mvc_Cover_t *pCover)

{
  Mvc_CubeWord_t MVar1;
  Mvc_Cube_t *pMVar2;
  uint uVar3;
  int _i_;
  uint uVar4;
  ulong uVar5;
  
  Mvc_CoverAllocateMask(pCover);
  Mvc_CoverCommonCube(pCover,pCover->pMask);
  pMVar2 = pCover->pMask;
  uVar4 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
  if (uVar4 == 0) {
    MVar1 = pMVar2->pData[0];
  }
  else {
    if (uVar4 != 1) {
      do {
        uVar3 = uVar4 >> 0x1f;
        if ((int)uVar4 < 0) {
          return uVar3;
        }
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 - 1;
      } while (pMVar2->pData[uVar5] == 0);
      return uVar3;
    }
    if (pMVar2->pData[0] != 0) {
      return 0;
    }
    MVar1 = *(Mvc_CubeWord_t *)&pMVar2->field_0x14;
  }
  return (uint)(MVar1 == 0);
}

Assistant:

int Mvc_CoverIsCubeFree( Mvc_Cover_t * pCover )
{
    int Result;
    // get the common cube
    Mvc_CoverAllocateMask( pCover );
    Mvc_CoverCommonCube( pCover, pCover->pMask );
    // check whether the common cube is empty
    Mvc_CubeBitEmpty( Result, pCover->pMask );
    return Result;
}